

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resultsummary.cpp
# Opt level: O0

void __thiscall trun::ResultSummary::SendResultToParentProc(ResultSummary *this)

{
  ResultSummary *this_local;
  
  return;
}

Assistant:

void ResultSummary::SendResultToParentProc() {
#ifdef TRUN_HAVE_FORK
    gnilk::IPCFifoUnix ipc;

    // Now, try to connect to the other side...
    if (!ipc.ConnectTo(Config::Instance().ipcName)) {
        return;
    }


    gnilk::IPCResultSummary summary;
    summary.testsExecuted = testsExecuted;
    summary.testsFailed = testsFailed;
    summary.durationSec = durationSec;
    // Create the test results objects
    for(auto res : results) {
        auto tr = new gnilk::IPCTestResults(res);
        tr->symbolName = res->SymbolName();
        // add to the ipc summary
        summary.testResults.push_back(tr);
    }

    gnilk::IPCBufferedWriter bufferedWriter(ipc);
    gnilk::IPCBinaryEncoder encoder(bufferedWriter);

    summary.Marshal(encoder);
    // Flush and send...
    bufferedWriter.Flush();
    ipc.Close();
#endif
}